

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void fast_forward_first_char2
               (compiler_common *common,PCRE2_UCHAR16 char1,PCRE2_UCHAR16 char2,sljit_s32 offset)

{
  sljit_compiler *compiler_00;
  ushort uVar1;
  sljit_s32 sVar2;
  BOOL BVar3;
  sljit_label *psVar4;
  sljit_jump *jump;
  sljit_jump *psVar5;
  sljit_jump *jump_00;
  bool bVar6;
  BOOL has_match_end;
  PCRE2_UCHAR16 mask;
  sljit_jump *partial_quit;
  sljit_jump *match;
  sljit_label *start;
  sljit_compiler *compiler;
  sljit_s32 offset_local;
  PCRE2_UCHAR16 char2_local;
  PCRE2_UCHAR16 char1_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  bVar6 = common->match_end_ptr != 0;
  if (bVar6) {
    sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->match_end_ptr);
  }
  if (0 < offset) {
    sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,(long)(offset << 1));
  }
  if (bVar6) {
    sljit_emit_op1(compiler_00,0x20,3,0,0xd,0);
    sljit_emit_op2(compiler_00,0x60,1,0,1,0,0x40,(long)((offset + 1) * 2));
    sljit_emit_op2(compiler_00,0x1062,0,0,0xd,0,1,0);
    sljit_emit_cmov(compiler_00,4,0xd,1,0);
  }
  sVar2 = sljit_has_cpu_feature(100);
  if (sVar2 == 0) {
    psVar4 = sljit_emit_label(compiler_00);
    jump = sljit_emit_cmp(compiler_00,3,2,0,0xd,0);
    if (common->mode == 1) {
      add_jump(compiler_00,&common->failed_match,jump);
    }
    sljit_emit_op1(compiler_00,0x23,1,0,0x82,0);
    sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,2);
    if (char1 == char2) {
      psVar5 = sljit_emit_cmp(compiler_00,1,1,0,0x40,(ulong)char1);
      sljit_set_label(psVar5,psVar4);
    }
    else {
      uVar1 = char1 ^ char2;
      BVar3 = is_powerof2((uint)uVar1);
      if (BVar3 == 0) {
        psVar5 = sljit_emit_cmp(compiler_00,0,1,0,0x40,(ulong)char1);
        jump_00 = sljit_emit_cmp(compiler_00,1,1,0,0x40,(ulong)char2);
        sljit_set_label(jump_00,psVar4);
        psVar4 = sljit_emit_label(compiler_00);
        sljit_set_label(psVar5,psVar4);
      }
      else {
        sljit_emit_op2(compiler_00,0x66,1,0,1,0,0x40,(ulong)uVar1);
        psVar5 = sljit_emit_cmp(compiler_00,1,1,0,0x40,(long)(int)(uint)(char1 | uVar1));
        sljit_set_label(psVar5,psVar4);
      }
    }
    sljit_emit_op2(compiler_00,0x62,2,0,2,0,0x40,(long)((offset + 1) * 2));
    if (common->mode != 1) {
      psVar4 = sljit_emit_label(compiler_00);
      sljit_set_label(jump,psVar4);
    }
    if (bVar6) {
      sljit_emit_op1(compiler_00,0x20,0xd,0,3,0);
    }
  }
  else {
    fast_forward_first_char2_sse2(common,char1,char2,offset);
    if (0 < offset) {
      sljit_emit_op2(compiler_00,0x62,2,0,2,0,0x40,(long)(offset << 1));
    }
    if (bVar6) {
      sljit_emit_op1(compiler_00,0x20,0xd,0,3,0);
    }
  }
  return;
}

Assistant:

static void fast_forward_first_char2(compiler_common *common, PCRE2_UCHAR char1, PCRE2_UCHAR char2, sljit_s32 offset)
{
DEFINE_COMPILER;
struct sljit_label *start;
struct sljit_jump *match;
struct sljit_jump *partial_quit;
PCRE2_UCHAR mask;
BOOL has_match_end = (common->match_end_ptr != 0);

SLJIT_ASSERT(common->mode == PCRE2_JIT_COMPLETE || offset == 0);

if (has_match_end)
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->match_end_ptr);

if (offset > 0)
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset));

if (has_match_end)
  {
  OP1(SLJIT_MOV, TMP3, 0, STR_END, 0);

  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, IN_UCHARS(offset + 1));
  OP2(SLJIT_SUB | SLJIT_SET_GREATER, SLJIT_UNUSED, 0, STR_END, 0, TMP1, 0);
  CMOV(SLJIT_GREATER, STR_END, TMP1, 0);
  }

#if (defined SLJIT_CONFIG_X86 && SLJIT_CONFIG_X86) && !(defined SUPPORT_VALGRIND)

/* SSE2 accelerated first character search. */

if (sljit_has_cpu_feature(SLJIT_HAS_SSE2))
  {
  fast_forward_first_char2_sse2(common, char1, char2, offset);

  if (offset > 0)
    OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset));

  if (has_match_end)
    OP1(SLJIT_MOV, STR_END, 0, TMP3, 0);
  return;
  }

#endif

start = LABEL();

partial_quit = CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0);
if (common->mode == PCRE2_JIT_COMPLETE)
  add_jump(compiler, &common->failed_match, partial_quit);

OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (char1 == char2)
  CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char1, start);
else
  {
  mask = char1 ^ char2;
  if (is_powerof2(mask))
    {
    OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, mask);
    CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char1 | mask, start);
    }
  else
    {
    match = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, char1);
    CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char2, start);
    JUMPHERE(match);
    }
  }

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH != 32
if (common->utf && offset > 0)
  {
  OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), IN_UCHARS(-(offset + 1)));
  jumpto_if_not_utf_char_start(compiler, TMP1, start);
  }
#endif

OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset + 1));

if (common->mode != PCRE2_JIT_COMPLETE)
  JUMPHERE(partial_quit);

if (has_match_end)
  OP1(SLJIT_MOV, STR_END, 0, TMP3, 0);
}